

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# levenberg_marquardt.cpp
# Opt level: O3

int __thiscall QuadraticFunctor::df(QuadraticFunctor *this,VectorXd *x,MatrixXd *fjac)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  int iVar4;
  double *pdVar5;
  long lVar6;
  double dVar7;
  Index IVar8;
  Index index;
  double *pdVar9;
  ulong uVar10;
  undefined8 *puVar11;
  Index row;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  VectorXd fvecMinus;
  VectorXd fvecPlus;
  VectorXd xPlus;
  VectorXd xMinus;
  VectorXd local_98;
  VectorXd local_88;
  QuadraticFunctor *local_70;
  DenseStorage<double,__1,__1,_1,_0> local_68;
  DenseStorage<double,__1,__1,_1,_0> *local_58;
  long local_50;
  DenseStorage<double,__1,__1,_1,_0> local_48;
  MatrixXd *local_38;
  
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            (&local_68,(DenseStorage<double,__1,__1,_1,_0> *)x);
  if (0 < local_68.m_rows) {
    lVar15 = 0;
    lVar16 = 0;
    local_70 = this;
    local_58 = (DenseStorage<double,__1,__1,_1,_0> *)x;
    local_38 = fjac;
    do {
      local_68.m_data[lVar16] = local_68.m_data[lVar16] + 9.999999747378752e-06;
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                (&local_48,(DenseStorage<double,__1,__1,_1,_0> *)x);
      if (local_48.m_rows <= lVar16) break;
      local_48.m_data[lVar16] = local_48.m_data[lVar16] + -9.999999747378752e-06;
      iVar4 = this->m;
      uVar13 = (ulong)iVar4;
      local_88.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)0x0;
      local_88.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
      if ((long)uVar13 < 0) {
LAB_00112df3:
        __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                      ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x130,
                      "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      pdVar9 = local_88.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      if (iVar4 != 0) {
        pdVar9 = (double *)malloc(uVar13 * 8);
        if (iVar4 != 1 && ((ulong)pdVar9 & 0xf) != 0) goto LAB_00112e12;
        if (pdVar9 == (double *)0x0) {
          puVar11 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar11 = std::ostream::_M_insert<long>;
          __cxa_throw(puVar11,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
      }
      local_88.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           pdVar9;
      local_88.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           uVar13;
      operator()(this,(VectorXd *)&local_68,&local_88);
      iVar4 = this->m;
      uVar13 = (ulong)iVar4;
      local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)0x0;
      local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
      if ((long)uVar13 < 0) goto LAB_00112df3;
      pdVar9 = local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      if (iVar4 != 0) {
        pdVar9 = (double *)malloc(uVar13 * 8);
        if (iVar4 != 1 && ((ulong)pdVar9 & 0xf) != 0) goto LAB_00112e12;
        if (pdVar9 == (double *)0x0) {
          puVar11 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar11 = std::ostream::_M_insert<long>;
          __cxa_throw(puVar11,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
      }
      local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           pdVar9;
      local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           uVar13;
      operator()(this,(VectorXd *)&local_48,&local_98);
      iVar4 = this->m;
      uVar13 = (ulong)iVar4;
      if ((long)uVar13 < 0) goto LAB_00112df3;
      if (iVar4 == 0) {
        pdVar9 = (double *)0x0;
      }
      else {
        pdVar9 = (double *)malloc(uVar13 * 8);
        if (iVar4 != 1 && ((ulong)pdVar9 & 0xf) != 0) goto LAB_00112e12;
        if (pdVar9 == (double *)0x0) {
          puVar11 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar11 = std::ostream::_M_insert<long>;
          __cxa_throw(puVar11,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
      }
      IVar8 = local_88.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows;
      pdVar3 = local_88.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      pdVar5 = local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      if (local_88.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          != local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows) {
        __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
                     );
      }
      if (local_88.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <
          0) {
        __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                      ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
                     );
      }
      local_50 = lVar15;
      if (local_88.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          == uVar13) {
LAB_00112c16:
        uVar10 = IVar8 & 0x7ffffffffffffffe;
        if (1 < (ulong)IVar8) {
          uVar12 = 0;
          do {
            pdVar1 = pdVar3 + uVar12;
            pdVar2 = pdVar5 + uVar12;
            auVar17._0_8_ = *pdVar1 - *pdVar2;
            auVar17._8_8_ = pdVar1[1] - pdVar2[1];
            auVar18._8_8_ = 0x3ef4f8b580000000;
            auVar18._0_8_ = 0x3ef4f8b580000000;
            auVar18 = divpd(auVar17,auVar18);
            *(undefined1 (*) [16])(pdVar9 + uVar12) = auVar18;
            uVar12 = uVar12 + 2;
          } while (uVar12 < uVar10);
        }
      }
      else {
        free(pdVar9);
        if (IVar8 != 0) {
          if ((ulong)IVar8 >> 0x3d != 0) {
LAB_00112f56:
            puVar11 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar11 = std::ostream::_M_insert<long>;
            __cxa_throw(puVar11,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
          pdVar9 = (double *)malloc(IVar8 * 8);
          if (IVar8 != 1 && ((ulong)pdVar9 & 0xf) != 0) {
LAB_00112e12:
            __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                          ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                          "void *Eigen::internal::aligned_malloc(std::size_t)");
          }
          uVar13 = IVar8;
          if (pdVar9 == (double *)0x0) goto LAB_00112f56;
          goto LAB_00112c16;
        }
        uVar10 = 0;
        pdVar9 = (double *)0x0;
        uVar13 = 0;
      }
      lVar15 = local_50;
      x = (VectorXd *)local_58;
      this = local_70;
      if ((long)uVar10 < IVar8) {
        do {
          pdVar9[uVar10] = (pdVar3[uVar10] - pdVar5[uVar10]) / 1.9999999494757503e-05;
          uVar10 = uVar10 + 1;
        } while (IVar8 != uVar10);
      }
      uVar10 = (ulong)local_70->m;
      pdVar5 = (local_38->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
               m_storage.m_data;
      if (pdVar5 != (double *)0x0 && (long)uVar10 < 0) {
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                      "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>>, Level = 0]"
                     );
      }
      if (((local_70->m < 0) ||
          (lVar6 = (local_38->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_rows, lVar6 < (long)uVar10)) ||
         ((local_38->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_cols <= lVar16)) {
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<Eigen::Matrix<double, -1, -1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                     );
      }
      if (uVar13 != uVar10) {
        __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                      "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>>]"
                     );
      }
      pdVar3 = pdVar5 + lVar6 * lVar16;
      if (((ulong)pdVar3 & 7) == 0) {
        uVar10 = (ulong)((uint)((ulong)pdVar3 >> 3) & 1);
        if (uVar13 <= uVar10) {
          uVar10 = uVar13;
        }
        if (uVar10 != 0) {
          *pdVar3 = *pdVar9;
        }
        uVar14 = uVar13 - uVar10 & 0xfffffffffffffffe;
        uVar12 = uVar14 | uVar10;
        if (0 < (long)uVar14) {
          do {
            dVar7 = (pdVar9 + uVar10)[1];
            pdVar3 = (double *)((long)pdVar5 + uVar10 * 8 + lVar6 * local_50);
            *pdVar3 = pdVar9[uVar10];
            pdVar3[1] = dVar7;
            uVar10 = uVar10 + 2;
          } while ((long)uVar10 < (long)uVar12);
        }
        if ((long)uVar12 < (long)uVar13) {
          do {
            *(double *)((long)pdVar5 + uVar12 * 8 + lVar6 * local_50) = pdVar9[uVar12];
            uVar12 = uVar12 + 1;
          } while ((long)uVar12 < (long)uVar13);
        }
      }
      else if (uVar13 != 0) {
        uVar10 = 0;
        do {
          *(double *)((long)pdVar5 + uVar10 * 8 + lVar6 * local_50) = pdVar9[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar13 != uVar10);
      }
      free(pdVar9);
      free(local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
      ;
      free(local_88.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
      ;
      free(local_48.m_data);
      free(local_68.m_data);
      lVar16 = lVar16 + 1;
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                (&local_68,(DenseStorage<double,__1,__1,_1,_0> *)x);
      lVar15 = lVar15 + 8;
    } while (lVar16 < local_68.m_rows);
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

int df(const Eigen::VectorXd &x, Eigen::MatrixXd &fjac) const
    {
        // 'x' has dimensions n x 1
        // It contains the current estimates for the parameters.

        // 'fjac' has dimensions m x n
        // It will contain the jacobian of the errors, calculated numerically in this case.

        float epsilon;
        epsilon = 1e-5f;

        for (int i = 0; i < x.size(); i++)
        {
            Eigen::VectorXd xPlus(x);
            xPlus(i) += epsilon;
            Eigen::VectorXd xMinus(x);
            xMinus(i) -= epsilon;

            Eigen::VectorXd fvecPlus(values());
            operator()(xPlus, fvecPlus);

            Eigen::VectorXd fvecMinus(values());
            operator()(xMinus, fvecMinus);

            Eigen::VectorXd fvecDiff(values());
            fvecDiff = (fvecPlus - fvecMinus) / (2.0f * epsilon);

            fjac.block(0, i, values(), 1) = fvecDiff;
        }
    }